

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O1

uchar mbedtls_ct_base64_enc_char(uchar value)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar5 = (uint)value;
  uVar6 = (uint)mbedtls_ct_zero;
  bVar1 = (byte)mbedtls_ct_zero;
  uVar2 = (uVar6 ^ uVar5) & 0xff;
  uVar7 = (uVar6 ^ uVar5) & 0xff;
  uVar4 = (uVar6 ^ uVar5) & 0xff;
  uVar3 = (uVar6 ^ uVar5) & 0xff;
  return ~((byte)(uVar3 + 0xffc1 >> 8) | (byte)(0x3f - uVar3 >> 8)) & (bVar1 ^ 0x2f) |
         ~((byte)(uVar4 + 0xffc2 >> 8) | (byte)(0x3e - uVar4 >> 8)) & (bVar1 ^ 0x2b) |
         ~((byte)(uVar7 + 0xffcc >> 8) | (byte)(0x3d - uVar7 >> 8)) & (bVar1 ^ value - 4) |
         ~((byte)(uVar2 + 0xffe6 >> 8) | (byte)(0x33 - uVar2 >> 8)) & (bVar1 ^ value + 0x47) |
         ~(byte)(0x19 - ((uVar6 ^ uVar5) & 0xff) >> 8) & (bVar1 ^ value + 0x41);
}

Assistant:

MBEDTLS_STATIC_TESTABLE
unsigned char mbedtls_ct_base64_enc_char(unsigned char value)
{
    unsigned char digit = 0;
    /* For each range of values, if value is in that range, mask digit with
     * the corresponding value. Since value can only be in a single range,
     * only at most one masking will change digit. */
    digit |= mbedtls_ct_uchar_in_range_if(0, 25, value, 'A' + value);
    digit |= mbedtls_ct_uchar_in_range_if(26, 51, value, 'a' + value - 26);
    digit |= mbedtls_ct_uchar_in_range_if(52, 61, value, '0' + value - 52);
    digit |= mbedtls_ct_uchar_in_range_if(62, 62, value, '+');
    digit |= mbedtls_ct_uchar_in_range_if(63, 63, value, '/');
    return digit;
}